

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O1

void __thiscall QLibraryPrivate::setLoadHints(QLibraryPrivate *this,LoadHints lh)

{
  QBasicMutex copy;
  
  if ((this->fileName).d.size == 0) {
    (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (__int_type_conflict)
         lh.super_QFlagsStorageHelper<QLibrary::LoadHint,_4>.super_QFlagsStorage<QLibrary::LoadHint>
         .i;
  }
  else {
    if ((AtomicType)qt_library_mutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
      LOCK();
      qt_library_mutex.d_ptr._q_value._M_b._M_p =
           (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
      UNLOCK();
    }
    else {
      QBasicMutex::lockInternal(&qt_library_mutex);
    }
    if ((this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i |
           (uint)lh.super_QFlagsStorageHelper<QLibrary::LoadHint,_4>.
                 super_QFlagsStorage<QLibrary::LoadHint>.i;
      UNLOCK();
    }
    copy.d_ptr._q_value._M_b._M_p = qt_library_mutex.d_ptr._q_value._M_b._M_p;
    LOCK();
    qt_library_mutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex(&qt_library_mutex,(void *)copy.d_ptr._q_value._M_b._M_p);
      return;
    }
  }
  return;
}

Assistant:

void QLibraryPrivate::setLoadHints(QLibrary::LoadHints lh)
{
    // Set the load hints directly for a dummy if this object is not associated
    // with a file. Such object is not shared between multiple instances.
    if (fileName.isEmpty()) {
        loadHintsInt.storeRelaxed(lh.toInt());
        return;
    }

    // this locks a global mutex
    QMutexLocker lock(&qt_library_mutex);
    mergeLoadHints(lh);
}